

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::RoundDecimalOperator::Operation<int,duckdb::NumericHelper>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference input_00;
  undefined7 in_register_00000031;
  int addition;
  int power_of_ten;
  int local_38;
  int local_34;
  undefined1 *local_30;
  int *local_28;
  
  local_34 = *(int *)(&NumericHelper::POWERS_OF_TEN +
                     (CONCAT71(in_register_00000031,scale) & 0xffffffff));
  local_38 = local_34 / 2;
  input_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  local_30 = (undefined1 *)&local_38;
  local_28 = &local_34;
  UnaryExecutor::
  ExecuteStandard<int,int,duckdb::UnaryLambdaWrapper,duckdb::RoundDecimalOperator::Operation<int,duckdb::NumericHelper>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(int)_1_>
            (input_00,result,*(idx_t *)(input + 0x18),&local_30,false,CAN_THROW_RUNTIME_ERROR);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		T addition = power_of_ten / 2;
		// regular round rounds towards the nearest number
		// in case of a tie we round away from zero
		// i.e. -10.5 -> -11, 10.5 -> 11
		// we implement this by adding (positive) or subtracting (negative) 0.5
		// and then flooring the number
		// e.g. 10.5 + 0.5 = 11, floor(11) = 11
		//      10.4 + 0.5 = 10.9, floor(10.9) = 10
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				input -= addition;
			} else {
				input += addition;
			}
			return UnsafeNumericCast<T>(input / power_of_ten);
		});
	}